

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

CURLcode Curl_ossl_add_session
                   (Curl_cfilter *cf,Curl_easy *data,char *ssl_peer_key,SSL_SESSION *session,
                   int ietf_tls_id,char *alpn,uchar *quic_tp,size_t quic_tp_len)

{
  int iVar1;
  CURLcode CVar2;
  ssl_config_data *psVar3;
  uchar *sdata;
  ulong uVar4;
  uchar *quic_tp_00;
  time_t tVar5;
  long lVar6;
  Curl_ssl_session *sc_session;
  size_t local_50;
  char *local_48;
  char *local_40;
  uchar *der_session_ptr;
  
  if ((data == (Curl_easy *)0x0 || cf == (Curl_cfilter *)0x0) ||
     (psVar3 = Curl_ssl_cf_get_config(cf,data), ((psVar3->primary).field_0x81 & 8) == 0)) {
    sdata = (uchar *)0x0;
    CVar2 = CURLE_OK;
  }
  else {
    sc_session = (Curl_ssl_session *)0x0;
    sdata = (uchar *)0x0;
    local_48 = ssl_peer_key;
    local_40 = alpn;
    iVar1 = i2d_SSL_SESSION((SSL_SESSION *)session,(uchar **)0x0);
    CVar2 = CURLE_OUT_OF_MEMORY;
    if (iVar1 != 0) {
      sdata = (uchar *)(*Curl_cmalloc)((long)iVar1);
      der_session_ptr = sdata;
      if (sdata != (uchar *)0x0) {
        iVar1 = i2d_SSL_SESSION((SSL_SESSION *)session,&der_session_ptr);
        if (iVar1 == 0) goto LAB_00166a0b;
        uVar4 = SSL_SESSION_get_max_early_data(session);
        if (quic_tp_len == 0 || quic_tp == (uchar *)0x0) {
          quic_tp_00 = (uchar *)0x0;
        }
        else {
          quic_tp_00 = (uchar *)Curl_memdup0((char *)quic_tp,quic_tp_len);
          uVar4 = uVar4 & 0xffffffff;
          if (quic_tp_00 == (uchar *)0x0) goto LAB_00166a0b;
        }
        local_50 = (size_t)iVar1;
        tVar5 = time((time_t *)0x0);
        lVar6 = SSL_SESSION_get_timeout((SSL_SESSION *)session);
        CVar2 = Curl_ssl_session_create2
                          (sdata,local_50,ietf_tls_id,local_40,tVar5 + lVar6,uVar4 & 0xffffffff,
                           quic_tp_00,quic_tp_len,&sc_session);
        sdata = (uchar *)0x0;
        if (CVar2 != CURLE_OK) goto LAB_00166a0b;
        CVar2 = Curl_ssl_scache_put(cf,data,local_48,sc_session);
      }
      sdata = (uchar *)0x0;
    }
  }
LAB_00166a0b:
  (*Curl_cfree)(sdata);
  return CVar2;
}

Assistant:

CURLcode Curl_ossl_add_session(struct Curl_cfilter *cf,
                               struct Curl_easy *data,
                               const char *ssl_peer_key,
                               SSL_SESSION *session,
                               int ietf_tls_id,
                               const char *alpn,
                               unsigned char *quic_tp,
                               size_t quic_tp_len)
{
  const struct ssl_config_data *config;
  unsigned char *der_session_buf = NULL;
  unsigned char *qtp_clone = NULL;
  CURLcode result = CURLE_OK;

  if(!cf || !data)
    goto out;

  config = Curl_ssl_cf_get_config(cf, data);
  if(config->primary.cache_session) {
    struct Curl_ssl_session *sc_session = NULL;
    size_t der_session_size;
    unsigned char *der_session_ptr;
    size_t earlydata_max = 0;

    der_session_size = i2d_SSL_SESSION(session, NULL);
    if(der_session_size == 0) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }

    der_session_buf = der_session_ptr = malloc(der_session_size);
    if(!der_session_buf) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }

    der_session_size = i2d_SSL_SESSION(session, &der_session_ptr);
    if(der_session_size == 0) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }

#ifdef HAVE_OPENSSL_EARLYDATA
    earlydata_max = SSL_SESSION_get_max_early_data(session);
#endif
    if(quic_tp && quic_tp_len) {
      qtp_clone = Curl_memdup0((char *)quic_tp, quic_tp_len);
      if(!qtp_clone) {
        result = CURLE_OUT_OF_MEMORY;
        goto out;
      }
    }

    result = Curl_ssl_session_create2(der_session_buf, der_session_size,
                                      ietf_tls_id, alpn,
                                      (curl_off_t)time(NULL) +
                                      SSL_SESSION_get_timeout(session),
                                      earlydata_max, qtp_clone, quic_tp_len,
                                      &sc_session);
    der_session_buf = NULL;  /* took ownership of sdata */
    if(!result) {
      result = Curl_ssl_scache_put(cf, data, ssl_peer_key, sc_session);
      /* took ownership of `sc_session` */
    }
  }

out:
  free(der_session_buf);
  return result;
}